

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O3

int testKNNValidatorNoDimension(void)

{
  bool bVar1;
  TypeUnion TVar2;
  NearestNeighborsIndex *this;
  ostream *poVar3;
  Model m1;
  Result res;
  Model local_70;
  Result local_40;
  
  CoreML::Specification::Model::Model(&local_70);
  CoreML::KNNValidatorTests::generateInterface(&local_70);
  if (local_70._oneof_case_[0] != 0x194) {
    CoreML::Specification::Model::clear_Type(&local_70);
    local_70._oneof_case_[0] = 0x194;
    TVar2.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x48);
    CoreML::Specification::KNearestNeighborsClassifier::KNearestNeighborsClassifier
              (TVar2.knearestneighborsclassifier_);
    local_70.Type_.pipelineclassifier_ = TVar2.pipelineclassifier_;
  }
  TVar2 = local_70.Type_;
  CoreML::KNNValidatorTests::setNumberOfNeighbors
            (local_70.Type_.knearestneighborsclassifier_,3,true);
  CoreML::KNNValidatorTests::addDataPoints(TVar2.knearestneighborsclassifier_);
  CoreML::KNNValidatorTests::addStringLabels(TVar2.knearestneighborsclassifier_);
  this = (NearestNeighborsIndex *)(TVar2.treeensembleregressor_)->treeensemble_;
  if (this == (NearestNeighborsIndex *)0x0) {
    this = (NearestNeighborsIndex *)operator_new(0x50);
    CoreML::Specification::NearestNeighborsIndex::NearestNeighborsIndex(this);
    (TVar2.knearestneighborsclassifier_)->nearestneighborsindex_ = this;
  }
  this->numberofdimensions_ = 0;
  CoreML::validate<(MLModelType)404>(&local_40,&local_70);
  bVar1 = CoreML::Result::good(&local_40);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
               ,0x6d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xad);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.m_message._M_dataplus._M_p != &local_40.m_message.field_2) {
    operator_delete(local_40.m_message._M_dataplus._M_p,
                    local_40.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_70);
  return (uint)bVar1;
}

Assistant:

int testKNNValidatorNoDimension() {

    Specification::Model m1;

    KNNValidatorTests::generateInterface(m1);

    auto *nnModel = m1.mutable_knearestneighborsclassifier();
    KNNValidatorTests::setNumberOfNeighbors(nnModel, 3, true);

    KNNValidatorTests::addDataPoints(nnModel);
    KNNValidatorTests::addStringLabels(nnModel);

    auto *nnIndex = nnModel->mutable_nearestneighborsindex();
    nnIndex->set_numberofdimensions(0);

    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);
    return 0;

}